

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_helpers.hpp
# Opt level: O0

void sdglib::write_flat_vector<NodePosition>
               (ofstream *ofs,vector<NodePosition,_std::allocator<NodePosition>_> *v)

{
  NodePosition *pNVar1;
  vector<NodePosition,_std::allocator<NodePosition>_> *in_RSI;
  char *in_RDI;
  uint64_t count;
  size_type local_18 [2];
  char *local_8;
  
  local_8 = in_RDI;
  local_18[0] = std::vector<NodePosition,_std::allocator<NodePosition>_>::size(in_RSI);
  std::ostream::write(local_8,(long)local_18);
  if (local_18[0] != 0) {
    pNVar1 = std::vector<NodePosition,_std::allocator<NodePosition>_>::data
                       ((vector<NodePosition,_std::allocator<NodePosition>_> *)0x4e81cd);
    std::ostream::write(local_8,(long)pNVar1);
  }
  return;
}

Assistant:

inline void write_flat_vector(std::ofstream &ofs, const std::vector<T> &v) {
        uint64_t count=v.size();
        ofs.write(reinterpret_cast<const char *>(&count),sizeof(count));
        if (count > 0) ofs.write(reinterpret_cast<const char *>(v.data()),sizeof(T)*count);
    }